

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9StripTagsFromString(jx9_context *pCtx,char *zIn,int nByte,char *zTaglist,int nTaglen)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  sxi32 sVar4;
  ushort **ppuVar5;
  ushort *puVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  undefined4 uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  byte *pbVar14;
  int *piVar15;
  int iVar16;
  byte *zString;
  byte *local_78;
  uint local_70;
  long local_68;
  int *local_60;
  SySet local_58;
  
  local_58.pAllocator = &pCtx->pVm->sAllocator;
  local_58.nUsed = 0;
  local_58.nSize = 0;
  local_58.eSize = 0x10;
  local_58.nCursor = 0;
  local_58.pBase = (void *)0x0;
  local_58.pUserData = (void *)0x0;
  if (0 < nTaglen) {
    pbVar9 = (byte *)(zTaglist + (uint)nTaglen);
LAB_001362f4:
    do {
      bVar1 = *zTaglist;
      if (((0x3f < (ulong)bVar1) || ((0x9000a00200000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
         ((0xbf < bVar1 ||
          (ppuVar5 = __ctype_b_loc(),
          (*(byte *)((long)*ppuVar5 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0)))) {
        pbVar14 = (byte *)zTaglist;
        if (zTaglist < pbVar9) {
          do {
            bVar1 = *pbVar14;
            if (((ulong)(long)(char)bVar1 < 0xffffffffffffffc0) &&
               (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(char)bVar1] & 8) == 0)) break;
            pbVar14 = pbVar14 + 1;
          } while (pbVar14 < pbVar9);
          if (pbVar14 <= zTaglist) goto LAB_00136429;
          uVar2 = (int)pbVar14 - (int)zTaglist;
          if (uVar2 != 0) {
            lVar12 = 0;
            local_78 = (byte *)zTaglist;
            local_70 = uVar2;
            do {
              bVar1 = ((byte *)zTaglist)[lVar12];
              if ((0xffffffffffffffbf < (ulong)(long)(char)bVar1) ||
                 (ppuVar5 = __ctype_b_loc(),
                 (*(byte *)((long)*ppuVar5 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0)) {
                uVar11 = (ulong)uVar2 - lVar12;
                local_70 = (uint)uVar11;
                local_78 = (byte *)zTaglist + lVar12;
                goto LAB_001363e1;
              }
              lVar12 = lVar12 + 1;
            } while (uVar2 != (uint)lVar12);
            zTaglist = (char *)((byte *)zTaglist + lVar12);
          }
          uVar10 = 0;
          local_78 = (byte *)zTaglist;
          goto LAB_00136411;
        }
        goto LAB_00136429;
      }
      zTaglist = (char *)((byte *)zTaglist + 1);
    } while (zTaglist < pbVar9);
  }
LAB_00136447:
  uVar2 = jx9_value_string(pCtx->pRet,"",0);
  if (nByte < 1) {
LAB_00136676:
    if (((jx9_vm *)local_58.pAllocator != (jx9_vm *)0x0) && (local_58.pBase != (void *)0x0)) {
      sVar4 = SyMemBackendFree(local_58.pAllocator,local_58.pBase);
      return sVar4;
    }
    return uVar2;
  }
  pbVar14 = (byte *)(zIn + nByte);
  uVar11 = local_58._16_8_ & 0xffffffff;
  local_60 = (int *)((long)local_58.pBase + 8);
  pbVar9 = (byte *)zIn;
LAB_0013647e:
  bVar1 = *zIn;
  uVar2 = (uint)bVar1;
  pbVar7 = (byte *)zIn;
  if ((bVar1 != 0) && (bVar1 != 0x3c)) {
    zIn = (char *)((byte *)zIn + 1);
    pbVar7 = (byte *)zIn;
    if (zIn < pbVar14) goto LAB_0013647e;
  }
  if (pbVar9 < pbVar7) {
    uVar2 = jx9_value_string(pCtx->pRet,(char *)pbVar9,(int)pbVar7 - (int)pbVar9);
  }
  if (pbVar7 < pbVar14) {
    uVar2 = -(int)pbVar7;
    zString = pbVar7;
    pbVar9 = pbVar7;
    while( true ) {
      pbVar9 = pbVar9 + 1;
      if (*zString != 0) break;
      zString = zString + 1;
      uVar2 = uVar2 - 1;
      pbVar7 = pbVar7 + 1;
      if (pbVar14 <= zString) goto LAB_00136676;
    }
    zIn = (char *)zString;
    if (*zString == 0x3c) {
      do {
        pbVar8 = pbVar9;
        if (pbVar14 <= pbVar8) break;
        pbVar9 = pbVar8 + 1;
      } while (*pbVar8 != 0x3e);
      zIn = (char *)(pbVar8 + 1);
      if (pbVar14 <= pbVar8) {
        zIn = (char *)pbVar8;
      }
      if (uVar11 != 0) {
        local_68 = (long)zIn - (long)pbVar7;
        pbVar9 = zString;
        pbVar7 = zString;
        if (0 < (int)local_68) {
          do {
            bVar1 = *pbVar9;
            if (((0x3f < (ulong)bVar1) || ((0x9000800000000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
               && ((pbVar7 = pbVar9, 0xbf < bVar1 ||
                   (ppuVar5 = __ctype_b_loc(),
                   (*(byte *)((long)*ppuVar5 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0)))) break;
            pbVar9 = pbVar9 + 1;
            pbVar7 = pbVar9;
          } while (pbVar9 < zString + (int)(uVar2 + (int)zIn));
        }
        while ((pbVar9 < zString + (int)(uVar2 + (int)zIn) &&
               ((bVar1 = *pbVar9, 0xffffffffffffffbf < (ulong)(long)(char)bVar1 ||
                (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(char)bVar1] & 8) != 0))))) {
          pbVar9 = pbVar9 + 1;
        }
        uVar3 = (int)pbVar9 - (int)pbVar7;
        uVar2 = uVar3;
        if (uVar3 != 0) {
          puVar6 = (ushort *)(ulong)uVar3;
          lVar12 = 0;
          do {
            bVar1 = pbVar7[lVar12];
            if (0xffffffffffffffbf < (ulong)(long)(char)bVar1) {
LAB_001365fd:
              iVar16 = ((int)pbVar7 - (int)pbVar9) + (int)lVar12;
              uVar13 = uVar11;
              piVar15 = local_60;
              goto LAB_00136617;
            }
            if (bVar1 != 0) {
              ppuVar5 = __ctype_b_loc();
              puVar6 = *ppuVar5;
              if ((*(byte *)((long)puVar6 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0)
              goto LAB_001365fd;
            }
            uVar2 = (uint)puVar6;
            lVar12 = lVar12 + 1;
          } while (uVar3 != (uint)lVar12);
        }
      }
    }
    goto LAB_00136653;
  }
  goto LAB_00136676;
  while ((int)uVar11 != 0) {
LAB_001363e1:
    uVar10 = (undefined4)uVar11;
    uVar11 = uVar11 - 1;
    uVar13 = (ulong)(char)((byte *)zTaglist + lVar12)[uVar11 & 0xffffffff];
    if ((0xffffffffffffffbf < uVar13) ||
       (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + uVar13 * 2 + 1) & 0x20) == 0))
    goto LAB_00136411;
  }
  uVar10 = 0;
LAB_00136411:
  local_70 = uVar10;
  SySetPut(&local_58,&local_78);
LAB_00136429:
  zTaglist = (char *)(pbVar14 + 1);
  if (pbVar9 <= zTaglist) goto LAB_00136447;
  goto LAB_001362f4;
  while( true ) {
    piVar15 = piVar15 + 4;
    uVar13 = uVar13 - 1;
    if (uVar13 == 0) break;
LAB_00136617:
    if (iVar16 + *piVar15 == 0) {
      uVar2 = SyStrnicmp(*(char **)(piVar15 + -2),(char *)(pbVar7 + lVar12),uVar3 - (int)lVar12);
    }
    else {
      uVar2 = *piVar15 + iVar16;
    }
    if (uVar2 == 0) {
      uVar2 = jx9_value_string(pCtx->pRet,(char *)zString,(int)local_68);
      break;
    }
  }
LAB_00136653:
  pbVar9 = (byte *)zIn;
  if (pbVar14 <= zIn) goto LAB_00136676;
  goto LAB_0013647e;
}

Assistant:

JX9_PRIVATE sxi32 jx9StripTagsFromString(jx9_context *pCtx, const char *zIn, int nByte, const char *zTaglist, int nTaglen)
{
	const char *zEnd = &zIn[nByte];
	const char *zPtr, *zTag;
	SySet sSet;
	/* initialize the set of allowed tags */
	SySetInit(&sSet, &pCtx->pVm->sAllocator, sizeof(SyString));
	if( nTaglen > 0 ){
		/* Set of allowed tags */
		AddTag(&sSet, zTaglist, nTaglen);
	}
	/* Set the empty string */
	jx9_result_string(pCtx, "", 0);
	/* Start processing */
	for(;;){
		if(zIn >= zEnd){
			/* No more input to process */
			break;
		}
		zPtr = zIn;
		/* Find a tag */
		while( zIn < zEnd && zIn[0] != '<' && zIn[0] != 0 /* NUL byte */ ){
			zIn++;
		}
		if( zIn > zPtr ){
			/* Consume raw input */
			jx9_result_string(pCtx, zPtr, (int)(zIn-zPtr));
		}
		/* Ignore trailing null bytes */
		while( zIn < zEnd && zIn[0] == 0 ){
			zIn++;
		}
		if(zIn >= zEnd){
			/* No more input to process */
			break;
		}
		if( zIn[0] == '<' ){
			sxi32 rc;
			zTag = zIn++;
			/* Delimit the tag */
			while( zIn < zEnd && zIn[0] != '>' ){
				zIn++;
			}
			if( zIn < zEnd ){
				zIn++; /* Ignore the trailing closing tag */
			}
			/* Query the set */
			rc = FindTag(&sSet, zTag, (int)(zIn-zTag));
			if( rc == SXRET_OK ){
				/* Keep the tag */
				jx9_result_string(pCtx, zTag, (int)(zIn-zTag));
			}
		}
	}
	/* Cleanup */
	SySetRelease(&sSet);
	return SXRET_OK;
}